

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.c
# Opt level: O1

DPlist AddDPPossibility(CP_Services Svcs,void *CP_Stream,DPlist List,CP_DP_Interface Interface,
                       char *Name,_SstParams *Params)

{
  CP_DP_Interface p_Var1;
  int iVar2;
  CP_DP_Interface *pp_Var3;
  uint uVar4;
  uint uVar5;
  
  if (Interface != (CP_DP_Interface)0x0) {
    if (List == (DPlist)0x0) {
      List = (DPlist)malloc(0x30);
      uVar5 = 0;
    }
    else {
      pp_Var3 = &List->Interface;
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        uVar4 = uVar5 + 1;
        p_Var1 = *pp_Var3;
        pp_Var3 = pp_Var3 + 3;
      } while (p_Var1 != (CP_DP_Interface)0x0);
      uVar5 = uVar5 - 1;
      List = (DPlist)realloc(List,(ulong)uVar4 * 0x18);
    }
    List[uVar5].Interface = Interface;
    List[uVar5].Name = Name;
    iVar2 = (*Interface->getPriority)(Svcs,CP_Stream,Params);
    List[uVar5].Priority = (long)iVar2;
    List[uVar5 + 1].Interface = (CP_DP_Interface)0x0;
  }
  return List;
}

Assistant:

static DPlist AddDPPossibility(CP_Services Svcs, void *CP_Stream, DPlist List,
                               CP_DP_Interface Interface, const char *Name,
                               struct _SstParams *Params)
{
    int Count = 0;
    if (Interface == NULL)
        return List;
    if (List == NULL)
    {
        List = malloc(2 * sizeof(*List));
    }
    else
    {
        while (List[Count].Interface)
        {
            Count++;
        }
        List = realloc(List, sizeof(*List) * (Count + 2));
    }
    List[Count].Interface = Interface;
    List[Count].Name = Name;
    List[Count].Priority = Interface->getPriority(Svcs, CP_Stream, Params);
    List[Count + 1].Interface = NULL;
    return List;
}